

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O2

ShaderProgram * __thiscall
deqp::gles3::Functional::MultiVertexArrayObjectTest::createProgram
          (MultiVertexArrayObjectTest *this,VertexArrayState *state)

{
  pointer pAVar1;
  RenderContext *renderCtx;
  uint uVar2;
  ostream *poVar3;
  ShaderProgram *this_00;
  char *pcVar4;
  int attribNdx;
  int iVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  float local_460;
  allocator<char> local_459;
  MultiVertexArrayObjectTest *local_458;
  string local_450;
  string local_430;
  ProgramSources local_410;
  stringstream vertexShaderStream;
  ostream local_330 [376];
  stringstream value;
  ostream local_1a8 [376];
  
  local_458 = this;
  std::__cxx11::stringstream::stringstream((stringstream *)&vertexShaderStream);
  std::__cxx11::stringstream::stringstream((stringstream *)&value);
  std::operator<<(local_330,"#version 300 es\n");
  lVar7 = 0x10;
  for (lVar6 = 0;
      pAVar1 = (state->attributes).
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar6 < (int)(((long)(state->attributes).
                           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) / 0x24);
      lVar6 = lVar6 + 1) {
    iVar5 = (int)lVar6;
    if ((&pAVar1->enabled)[lVar7] == '\0') {
      poVar3 = std::operator<<(local_330,"layout(location = ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
      poVar3 = std::operator<<(poVar3,") in mediump vec4 a_attrib");
    }
    else {
      poVar3 = std::operator<<(local_330,"layout(location = ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
      poVar3 = std::operator<<(poVar3,") in mediump ivec4 a_attrib");
    }
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
    std::operator<<(poVar3,";\n");
    pAVar1 = (state->attributes).
             super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((&pAVar1->enabled)[lVar7] == '\0') {
      if ((*(int *)((long)pAVar1 + lVar7 + -4) == 0x1406) ||
         (*(char *)((long)&pAVar1->type + lVar7) != '\0')) {
        pcVar4 = " + ";
        if (lVar6 == 0) {
          pcVar4 = "";
        }
        poVar3 = std::operator<<(local_1a8,pcVar4);
        poVar3 = std::operator<<(poVar3,"a_attrib");
        std::ostream::operator<<(poVar3,iVar5);
      }
      else {
        uVar2 = pAVar1->type - 0x1400;
        fVar8 = 0.0;
        if (uVar2 < 6) {
          fVar8 = *(float *)(&DAT_009bfb64 + (ulong)uVar2 * 4);
        }
        pcVar4 = " + ";
        if (lVar6 == 0) {
          pcVar4 = "";
        }
        poVar3 = std::operator<<(local_1a8,pcVar4);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar8);
        poVar3 = std::operator<<(poVar3," * a_attrib");
        std::ostream::operator<<(poVar3,iVar5);
      }
    }
    else {
      uVar2 = pAVar1->type - 0x1400;
      fVar8 = 0.0;
      if (uVar2 < 6) {
        fVar8 = *(float *)(&DAT_009bfb7c + (ulong)uVar2 * 4);
      }
      pcVar4 = " + ";
      if (lVar6 == 0) {
        pcVar4 = "";
      }
      poVar3 = std::operator<<(local_1a8,pcVar4);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar8);
      poVar3 = std::operator<<(poVar3," * vec4(a_attrib");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
      std::operator<<(poVar3,")");
    }
    lVar7 = lVar7 + 0x24;
  }
  poVar3 = std::operator<<(local_330,"out mediump vec4 v_value;\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"\tv_value = ");
  std::__cxx11::stringbuf::str();
  poVar3 = std::operator<<(poVar3,(string *)&local_410);
  std::operator<<(poVar3,";\n");
  std::__cxx11::string::~string((string *)&local_410);
  pAVar1 = (state->attributes).
           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pAVar1->integer != '\0') {
    uVar2 = pAVar1->type - 0x1400;
    local_460 = 0.0;
    if (uVar2 < 6) {
      local_460 = *(float *)(&DAT_009bfb7c + (ulong)uVar2 * 4);
    }
    poVar3 = std::operator<<(local_330,"\tgl_Position = vec4(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_460);
    poVar3 = std::operator<<(poVar3," * ");
    poVar3 = std::operator<<(poVar3,"a_attrib0.xyz, 1.0);\n");
    std::operator<<(poVar3,"}");
    goto LAB_005be6ab;
  }
  if (pAVar1->normalized == '\0') {
    switch(pAVar1->type) {
    case 0x1400:
      fVar8 = 0.007936508;
      break;
    case 0x1401:
      fVar8 = 0.003937008;
      break;
    case 0x1402:
      fVar8 = 3.051944e-05;
      break;
    case 0x1403:
      fVar8 = 1.5259255e-05;
      break;
    case 0x1404:
      fVar8 = 4.656613e-10;
      break;
    case 0x1405:
      fVar8 = 2.3283064e-10;
      break;
    case 0x1406:
      goto switchD_005be615_caseD_1406;
    default:
      fVar8 = 0.0;
    }
    poVar3 = std::operator<<(local_330,"\tgl_Position = vec4(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar8);
    poVar3 = std::operator<<(poVar3," * ");
    poVar3 = std::operator<<(poVar3,"vec3(a_attrib0.xyz), 1.0);\n");
    std::operator<<(poVar3,"}");
  }
  else {
switchD_005be615_caseD_1406:
    poVar3 = std::operator<<(local_330,"\tgl_Position = vec4(a_attrib0.xyz, 1.0);\n");
    std::operator<<(poVar3,"}");
  }
LAB_005be6ab:
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((local_458->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,
             "#version 300 es\nin mediump vec4 v_value;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(v_value.xyz, 1.0);\n}"
             ,&local_459);
  glu::makeVtxFragSources(&local_410,&local_430,&local_450);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_410);
  glu::ProgramSources::~ProgramSources(&local_410);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::stringstream::~stringstream((stringstream *)&value);
  std::__cxx11::stringstream::~stringstream((stringstream *)&vertexShaderStream);
  return this_00;
}

Assistant:

glu::ShaderProgram* MultiVertexArrayObjectTest::createProgram (const VertexArrayState& state)
{
	std::stringstream vertexShaderStream;
	std::stringstream value;

	vertexShaderStream << "#version 300 es\n";

	for (int attribNdx = 0; attribNdx < (int)state.attributes.size(); attribNdx++)
	{
		if (state.attributes[attribNdx].integer)
			vertexShaderStream << "layout(location = " << attribNdx << ") in mediump ivec4 a_attrib" << attribNdx << ";\n";
		else
			vertexShaderStream << "layout(location = " << attribNdx << ") in mediump vec4 a_attrib" << attribNdx << ";\n";

		if (state.attributes[attribNdx].integer)
		{
			float scale = 0.0f;

			switch (state.attributes[0].type)
			{
				case GL_SHORT:			scale  = (1.0f/float((1u<<14)-1u));	break;
				case GL_UNSIGNED_SHORT:	scale  = (1.0f/float((1u<<15)-1u));	break;
				case GL_INT:			scale  = (1.0f/float((1u<<30)-1u));	break;
				case GL_UNSIGNED_INT:	scale  = (1.0f/float((1u<<31)-1u));	break;
				case GL_BYTE:			scale  = (1.0f/float((1u<<6)-1u));	break;
				case GL_UNSIGNED_BYTE:	scale  = (1.0f/float((1u<<7)-1u));	break;

				default:
					DE_ASSERT(DE_FALSE);
			}
			value << (attribNdx != 0 ? " + " : "" ) << scale << " * vec4(a_attrib" << attribNdx << ")";
		}
		else if (state.attributes[attribNdx].type != GL_FLOAT && !state.attributes[attribNdx].normalized)
		{
			float scale = 0.0f;

			switch (state.attributes[0].type)
			{
				case GL_SHORT:			scale  = (0.5f/float((1u<<14)-1u));	break;
				case GL_UNSIGNED_SHORT:	scale  = (0.5f/float((1u<<15)-1u));	break;
				case GL_INT:			scale  = (0.5f/float((1u<<30)-1u));	break;
				case GL_UNSIGNED_INT:	scale  = (0.5f/float((1u<<31)-1u));	break;
				case GL_BYTE:			scale  = (0.5f/float((1u<<6)-1u));	break;
				case GL_UNSIGNED_BYTE:	scale  = (0.5f/float((1u<<7)-1u));	break;

				default:
					DE_ASSERT(DE_FALSE);
			}
			value << (attribNdx != 0 ? " + " : "" ) << scale << " * a_attrib" << attribNdx;
		}
		else
			value << (attribNdx != 0 ? " + " : "" ) << "a_attrib" << attribNdx;
	}

	vertexShaderStream
		<< "out mediump vec4 v_value;\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "\tv_value = " << value.str() << ";\n";

	if (state.attributes[0].integer)
	{
		float scale = 0.0f;

		switch (state.attributes[0].type)
		{
			case GL_SHORT:			scale  = (1.0f/float((1u<<14)-1u));	break;
			case GL_UNSIGNED_SHORT:	scale  = (1.0f/float((1u<<15)-1u));	break;
			case GL_INT:			scale  = (1.0f/float((1u<<30)-1u));	break;
			case GL_UNSIGNED_INT:	scale  = (1.0f/float((1u<<31)-1u));	break;
			case GL_BYTE:			scale  = (1.0f/float((1u<<6)-1u));	break;
			case GL_UNSIGNED_BYTE:	scale  = (1.0f/float((1u<<7)-1u));	break;


			default:
				DE_ASSERT(DE_FALSE);
		}

		vertexShaderStream
			<< "\tgl_Position = vec4(" << scale << " * " <<  "a_attrib0.xyz, 1.0);\n"
			<< "}";
	}
	else
	{
		if (state.attributes[0].normalized || state.attributes[0].type == GL_FLOAT)
		{
			vertexShaderStream
				<< "\tgl_Position = vec4(a_attrib0.xyz, 1.0);\n"
				<< "}";
		}
		else
		{
			float scale = 0.0f;

			switch (state.attributes[0].type)
			{
				case GL_SHORT:			scale  = (1.0f/float((1u<<14)-1u));	break;
				case GL_UNSIGNED_SHORT:	scale  = (1.0f/float((1u<<15)-1u));	break;
				case GL_INT:			scale  = (1.0f/float((1u<<30)-1u));	break;
				case GL_UNSIGNED_INT:	scale  = (1.0f/float((1u<<31)-1u));	break;
				case GL_BYTE:			scale  = (1.0f/float((1u<<6)-1u));	break;
				case GL_UNSIGNED_BYTE:	scale  = (1.0f/float((1u<<7)-1u));	break;

				default:
					DE_ASSERT(DE_FALSE);
			}

			scale *= 0.5f;

			vertexShaderStream
				<< "\tgl_Position = vec4(" << scale << " * " <<  "vec3(a_attrib0.xyz), 1.0);\n"
				<< "}";
		}
	}

	const char* fragmentShader =
	"#version 300 es\n"
	"in mediump vec4 v_value;\n"
	"layout(location = 0) out mediump vec4 fragColor;\n"
	"void main (void)\n"
	"{\n"
	"\tfragColor = vec4(v_value.xyz, 1.0);\n"
	"}";

	return new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertexShaderStream.str(), fragmentShader));
}